

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O2

size_t highwayhash::MinRange<unsigned_int>(uint *sorted,size_t idx_begin,size_t half_count)

{
  size_t sVar1;
  ulong uVar2;
  size_t idx;
  uint uVar3;
  uint uVar4;
  
  uVar2 = half_count + idx_begin;
  uVar3 = 0xffffffff;
  sVar1 = 0;
  while( true ) {
    if (uVar2 <= idx_begin) {
      return sVar1;
    }
    uVar4 = sorted[half_count + idx_begin] - sorted[idx_begin];
    if (sorted[half_count + idx_begin] < sorted[idx_begin]) break;
    if (uVar4 < uVar3) {
      uVar3 = uVar4;
      sVar1 = idx_begin;
    }
    idx_begin = idx_begin + 1;
  }
  __assert_fail("sorted[idx] <= sorted[idx + half_count]",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                ,0x29,
                "size_t highwayhash::MinRange(const T *const __restrict, const size_t, const size_t) [T = unsigned int]"
               );
}

Assistant:

size_t MinRange(const T* const HH_RESTRICT sorted, const size_t idx_begin,
                const size_t half_count) {
  T min_range = std::numeric_limits<T>::max();
  size_t min_idx = 0;

  for (size_t idx = idx_begin; idx < idx_begin + half_count; ++idx) {
    assert(sorted[idx] <= sorted[idx + half_count]);
    const T range = sorted[idx + half_count] - sorted[idx];
    if (range < min_range) {
      min_range = range;
      min_idx = idx;
    }
  }

  return min_idx;
}